

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,long,long,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,false>
               (long *ldata,long *rdata,long *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar3 = 0;
      do {
        result_data[iVar3] = ldata[iVar3] - rdata[iVar3];
        iVar3 = iVar3 + 1;
      } while (count != iVar3);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar7 = 0;
    uVar5 = 0;
    do {
      uVar2 = puVar1[uVar7];
      uVar4 = uVar5 + 0x40;
      if (count <= uVar5 + 0x40) {
        uVar4 = count;
      }
      uVar6 = uVar4;
      if (uVar2 != 0) {
        uVar6 = uVar5;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar5 < uVar4) {
            do {
              result_data[uVar6] = ldata[uVar6] - rdata[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar4 != uVar6);
          }
        }
        else if (uVar5 < uVar4) {
          uVar6 = 0;
          do {
            if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
              result_data[uVar5 + uVar6] = ldata[uVar5 + uVar6] - rdata[uVar5 + uVar6];
            }
            uVar6 = uVar6 + 1;
          } while ((uVar5 - uVar4) + uVar6 != 0);
          uVar6 = uVar5 + uVar6;
        }
      }
      uVar7 = uVar7 + 1;
      uVar5 = uVar6;
    } while (uVar7 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}